

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_init(nn_fsm *self,nn_fsm_fn fn,nn_fsm_fn shutdown_fn,int src,void *srcptr,nn_fsm *owner)

{
  nn_fsm *owner_local;
  void *srcptr_local;
  int src_local;
  nn_fsm_fn shutdown_fn_local;
  nn_fsm_fn fn_local;
  nn_fsm *self_local;
  
  self->fn = fn;
  self->shutdown_fn = shutdown_fn;
  self->state = 1;
  self->src = src;
  self->srcptr = srcptr;
  self->owner = owner;
  self->ctx = owner->ctx;
  nn_fsm_event_init(&self->stopped);
  return;
}

Assistant:

void nn_fsm_init (struct nn_fsm *self, nn_fsm_fn fn,
    nn_fsm_fn shutdown_fn, int src, void *srcptr, struct nn_fsm *owner)
{
    self->fn = fn;
    self->shutdown_fn = shutdown_fn;
    self->state = NN_FSM_STATE_IDLE;
    self->src = src;
    self->srcptr = srcptr;
    self->owner = owner;
    self->ctx = owner->ctx;
    nn_fsm_event_init (&self->stopped);
}